

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
booster::locale::ios_info::string_set::get<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,string_set *this)

{
  bool bVar1;
  undefined8 *puVar2;
  allocator local_11;
  
  if (this->type != (type_info *)0x0) {
    bVar1 = std::type_info::operator!=(this->type,(type_info *)&wchar_t::typeinfo);
    if (!bVar1) {
      std::__cxx11::wstring::wstring
                ((wstring *)__return_storage_ptr__,(wchar_t *)this->ptr,&local_11);
      return __return_storage_ptr__;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &std::__cxx11::moneypunct<char,true>::id;
  __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::basic_string<Char> get() const
                {
                    if(type==0 || *type!=typeid(Char))
                        throw std::bad_cast();
                    std::basic_string<Char> result = reinterpret_cast<Char const *>(ptr);
                    return result;
                }